

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t driver::zeEventHostSynchronize(ze_event_handle_t hEvent,uint64_t timeout)

{
  ze_pfnEventHostSynchronize_t pfnHostSynchronize;
  ze_result_t result;
  uint64_t timeout_local;
  ze_event_handle_t hEvent_local;
  
  pfnHostSynchronize._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c5e8 != (code *)0x0) {
    pfnHostSynchronize._4_4_ = (*DAT_0011c5e8)(hEvent,timeout);
  }
  return pfnHostSynchronize._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventHostSynchronize(
        ze_event_handle_t hEvent,                       ///< [in] handle of the event
        uint64_t timeout                                ///< [in] if non-zero, then indicates the maximum time (in nanoseconds) to
                                                        ///< yield before returning ::ZE_RESULT_SUCCESS or ::ZE_RESULT_NOT_READY;
                                                        ///< if zero, then operates exactly like ::zeEventQueryStatus;
                                                        ///< if `UINT64_MAX`, then function will not return until complete or
                                                        ///< device is lost.
                                                        ///< Due to external dependencies, timeout may be rounded to the closest
                                                        ///< value allowed by the accuracy of those dependencies.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnHostSynchronize = context.zeDdiTable.Event.pfnHostSynchronize;
        if( nullptr != pfnHostSynchronize )
        {
            result = pfnHostSynchronize( hEvent, timeout );
        }
        else
        {
            // generic implementation
        }

        return result;
    }